

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void GCTM(lua_State *L,int propagateerrors)

{
  byte bVar1;
  lu_byte lVar2;
  lu_byte lVar3;
  global_State *pgVar4;
  StkId pTVar5;
  int errcode;
  TValue *pTVar6;
  char *pcVar7;
  TValue *io2;
  TValue v;
  Value local_38;
  uint local_30;
  
  pgVar4 = L->l_G;
  local_38 = (Value)pgVar4->tobefnz;
  pgVar4->tobefnz = *(GCObject **)local_38.gc;
  *(GCObject **)local_38.gc = pgVar4->allgc;
  pgVar4->allgc = (GCObject *)local_38;
  bVar1 = (byte)local_38.f[9];
  local_38.f[9] = (_func_int_lua_State_ptr)(bVar1 & 0xef);
  if (1 < pgVar4->gcstate) {
    local_38.f[9] = (_func_int_lua_State_ptr)(pgVar4->currentwhite & 3 | bVar1 & 0xa8);
  }
  local_30 = (byte)local_38.f[8] | 0x40;
  pTVar6 = luaT_gettmbyobj(L,(TValue *)&local_38,TM_GC);
  if ((pTVar6 != (TValue *)0x0) && ((pTVar6->tt_ & 0xfU) == 6)) {
    lVar2 = L->allowhook;
    lVar3 = pgVar4->gcrunning;
    L->allowhook = '\0';
    pgVar4->gcrunning = '\0';
    pTVar5 = L->top;
    pTVar5->value_ = pTVar6->value_;
    pTVar5->tt_ = pTVar6->tt_;
    pTVar5 = L->top;
    pTVar5[1].value_.f = (lua_CFunction)local_38;
    pTVar5[1].tt_ = local_30;
    pTVar5 = L->top;
    L->top = pTVar5 + 2;
    errcode = luaD_pcall(L,dothecall,(void *)0x0,(long)pTVar5 - (long)L->stack,0);
    L->allowhook = lVar2;
    pgVar4->gcrunning = lVar3;
    if ((propagateerrors != 0) && (errcode != 0)) {
      if (errcode == 2) {
        if ((L->top[-1].tt_ & 0xfU) == 4) {
          pcVar7 = (char *)(L->top[-1].value_.f + 0x18);
        }
        else {
          pcVar7 = "no message";
        }
        luaO_pushfstring(L,"error in __gc metamethod (%s)",pcVar7);
        errcode = 5;
      }
      luaD_throw(L,errcode);
    }
  }
  return;
}

Assistant:

static void GCTM (lua_State *L, int propagateerrors) {
  global_State *g = G(L);
  const TValue *tm;
  TValue v;
  setgcovalue(L, &v, udata2finalize(g));
  tm = luaT_gettmbyobj(L, &v, TM_GC);
  if (tm != NULL && ttisfunction(tm)) {  /* is there a finalizer? */
    int status;
    lu_byte oldah = L->allowhook;
    int running  = g->gcrunning;
    L->allowhook = 0;  /* stop debug hooks during GC metamethod */
    g->gcrunning = 0;  /* avoid GC steps */
    setobj2s(L, L->top, tm);  /* push finalizer... */
    setobj2s(L, L->top + 1, &v);  /* ... and its argument */
    L->top += 2;  /* and (next line) call the finalizer */
    status = luaD_pcall(L, dothecall, NULL, savestack(L, L->top - 2), 0);
    L->allowhook = oldah;  /* restore hooks */
    g->gcrunning = running;  /* restore state */
    if (status != LUA_OK && propagateerrors) {  /* error while running __gc? */
      if (status == LUA_ERRRUN) {  /* is there an error object? */
        const char *msg = (ttisstring(L->top - 1))
                            ? svalue(L->top - 1)
                            : "no message";
        luaO_pushfstring(L, "error in __gc metamethod (%s)", msg);
        status = LUA_ERRGCMM;  /* error in __gc metamethod */
      }
      luaD_throw(L, status);  /* re-throw error */
    }
  }
}